

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O1

Own<kj::Directory> __thiscall kj::anon_unknown_0::TempDir::get(TempDir *this)

{
  int iVar1;
  Directory *extraout_RDX;
  undefined8 *in_RSI;
  char *__file;
  Own<kj::Directory> OVar2;
  Fault f;
  AutoCloseFd local_58;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  do {
    __file = "";
    if (in_RSI[1] != 0) {
      __file = (char *)*in_RSI;
    }
    iVar1 = 0;
    local_58.fd = open(__file,0);
  } while ((local_58.fd < 0) && (iVar1 = _::Debug::getOsErrorNumber(false), iVar1 == -1));
  if (iVar1 == 0) {
    UnwindDetector::UnwindDetector(&local_58.unwindDetector);
    newDiskDirectory((kj *)this,&local_58);
    AutoCloseFd::~AutoCloseFd(&local_58);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  local_50.exception = (Exception *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  _::Debug::Fault::init
            (&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
            );
  _::Debug::Fault::fatal(&local_50);
}

Assistant:

Own<Directory> get() {
    int fd;
    KJ_SYSCALL(fd = open(filename.cStr(), O_RDONLY));
    return newDiskDirectory(AutoCloseFd(fd));
  }